

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subprocess.cpp
# Opt level: O0

void captureExecutedProcessOutput
               (ProcessDelegate *delegate,ManagedDescriptor *outputPipe,ProcessHandle handle,
               ProcessContext *ctx)

{
  FileDescriptor hFile;
  int iVar1;
  int *piVar2;
  int __fd;
  Twine local_10f8;
  string local_10e0;
  Twine local_10c0;
  Twine local_10a8;
  Twine local_1090;
  Twine local_1078;
  uint64_t local_1060;
  int local_1054;
  long lStack_1050;
  int err;
  ssize_t numBytes;
  char buf [4096];
  ProcessContext *ctx_local;
  ManagedDescriptor *outputPipe_local;
  ProcessDelegate *delegate_local;
  ProcessHandle handle_local;
  ssize_t *destinationBuffer;
  
  while( true ) {
    hFile = ManagedDescriptor::unsafeDescriptor(outputPipe);
    destinationBuffer = &numBytes;
    iVar1 = llbuild::basic::sys::FileDescriptorTraits<int>::Read(hFile,destinationBuffer,0x1000);
    __fd = (int)destinationBuffer;
    lStack_1050 = (long)iVar1;
    if (lStack_1050 < 0) break;
    if (lStack_1050 == 0) goto LAB_0022ba2e;
    (*delegate->_vptr_ProcessDelegate[4])(delegate,ctx,handle.id,&numBytes,lStack_1050);
  }
  piVar2 = __errno_location();
  local_1054 = *piVar2;
  local_1060 = handle.id;
  llvm::Twine::Twine(&local_10a8,"unable to read process output (");
  llbuild::basic::sys::strerror_abi_cxx11_((sys *)&local_10e0,local_1054);
  llvm::Twine::Twine(&local_10c0,&local_10e0);
  llvm::operator+(&local_1090,&local_10a8,&local_10c0);
  llvm::Twine::Twine(&local_10f8,")");
  llvm::operator+(&local_1078,&local_1090,&local_10f8);
  (*delegate->_vptr_ProcessDelegate[3])(delegate,ctx,local_1060,&local_1078);
  __fd = (int)ctx;
  std::__cxx11::string::~string((string *)&local_10e0);
LAB_0022ba2e:
  ManagedDescriptor::close(outputPipe,__fd);
  return;
}

Assistant:

static void captureExecutedProcessOutput(ProcessDelegate& delegate,
                                         ManagedDescriptor& outputPipe,
                                         ProcessHandle handle,
                                         ProcessContext* ctx) {
  while (true) {
    char buf[4096];
    ssize_t numBytes =
        sys::FileDescriptorTraits<>::Read(outputPipe.unsafeDescriptor(), buf, sizeof(buf));
    if (numBytes < 0) {
      int err = errno;
      delegate.processHadError(ctx, handle,
                               Twine("unable to read process output (") +
                                   sys::strerror(err) + ")");
      break;
    }

    if (numBytes == 0)
      break;

    // Notify the client of the output.
    delegate.processHadOutput(ctx, handle, StringRef(buf, numBytes));
  }
  // We have receieved the zero byte read that indicates an EOF.
  // Go ahead and close the pipe (it was going to be closed automatically).
  outputPipe.close();
}